

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<int,_true,_std::allocator<unsigned_long>_>::View
          (View<int,_true,_std::allocator<unsigned_long>_> *this,pointer data,
          allocator_type *allocator)

{
  allocator_type local_11;
  
  this->data_ = data;
  marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry
            (&this->geometry_,0,&defaultOrder,1,true,&local_11);
  testInvariant(this);
  return;
}

Assistant:

inline
View<T, isConst, A>::View
(
    pointer data,
    const allocator_type& allocator
)
: data_(data),
  geometry_(geometry_type(0, defaultOrder, 1, true, allocator))
{
    testInvariant();
}